

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<kj::(anonymous_namespace)::SocketAddress> * __thiscall
kj::heapArray<kj::(anonymous_namespace)::SocketAddress>
          (Array<kj::(anonymous_namespace)::SocketAddress> *__return_storage_ptr__,kj *this,
          ArrayPtr<kj::(anonymous_namespace)::SocketAddress> content)

{
  SocketAddress *size;
  Array<kj::(anonymous_namespace)::SocketAddress> *result;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> builder;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> local_48;
  
  size = content.ptr;
  heapArrayBuilder<kj::(anonymous_namespace)::SocketAddress>(&local_48,(size_t)size);
  if (size != (SocketAddress *)0x0) {
    memcpy(local_48.pos,this,(long)size * 0x88);
  }
  __return_storage_ptr__->ptr = local_48.ptr;
  __return_storage_ptr__->size_ =
       ((long)local_48.pos + ((long)size * 0x88 - (long)local_48.ptr)) / 0x88;
  __return_storage_ptr__->disposer = local_48.disposer;
  local_48.ptr = (SocketAddress *)0x0;
  local_48.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
  local_48.endPtr = (SocketAddress *)0x0;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::~ArrayBuilder(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Array<T> heapArray(ArrayPtr<T> content) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(content.size());
  builder.addAll(content);
  return builder.finish();
}